

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_blake256.c
# Opt level: O1

void blake224_hash(uint8_t *out,uint8_t *in,uint64_t inlen)

{
  state_conflict local_98;
  
  local_98.h[0] = 0xc1059ed8;
  local_98.h[1] = 0x367cd507;
  local_98.h[2] = 0x3070dd17;
  local_98.h[3] = 0xf70e5939;
  local_98.h[4] = 0xffc00b31;
  local_98.h[5] = 0x68581511;
  local_98.h[6] = 0x64f98fa7;
  local_98.h[7] = 0xbefa4fa4;
  local_98.s[0] = 0;
  local_98.s[1] = 0;
  local_98.s[2] = 0;
  local_98.s[3] = 0;
  local_98.t[0] = 0;
  local_98.t[1] = 0;
  local_98.buflen = 0;
  local_98.nullt = 0;
  blake256_update(&local_98,in,inlen << 3);
  blake256_final_h(&local_98,out,0x80,'\0');
  return;
}

Assistant:

void blake224_hash(uint8_t *out, const uint8_t *in, uint64_t inlen) {
    state S;
    blake224_init(&S);
    blake224_update(&S, in, inlen * 8);
    blake224_final(&S, out);
}